

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall pbrt::Disk::readFrom(Disk *this,BinaryReader *binary)

{
  size_t sVar1;
  pointer puVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  runtime_error *this_00;
  
  Shape::readFrom(&this->super_Shape,binary);
  puVar2 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(binary->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2) <
      binary->currentEntityOffset + 4) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    this->radius = *(float *)(puVar2 + binary->currentEntityOffset);
    sVar3 = binary->currentEntityOffset;
    sVar1 = sVar3 + 4;
    binary->currentEntityOffset = sVar1;
    puVar2 = (binary->currentEntityData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(binary->currentEntityData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2) < sVar3 + 8) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
    else {
      this->height = *(float *)(puVar2 + sVar1);
      sVar1 = binary->currentEntityOffset;
      binary->currentEntityOffset = sVar1 + 4;
      puVar2 = (binary->currentEntityData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (sVar1 + 0x34 <=
          (ulong)((long)(binary->currentEntityData).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2)) {
        uVar4 = *(undefined8 *)(puVar2 + sVar1 + 4);
        uVar5 = *(undefined8 *)(puVar2 + sVar1 + 4 + 8);
        uVar6 = *(undefined8 *)(puVar2 + sVar1 + 0x14);
        uVar7 = *(undefined8 *)(puVar2 + sVar1 + 0x14 + 8);
        uVar8 = *(undefined8 *)(puVar2 + sVar1 + 0x24 + 8);
        *(undefined8 *)&(this->transform).l.vz.z = *(undefined8 *)(puVar2 + sVar1 + 0x24);
        (this->transform).p.y = (float)(int)uVar8;
        (this->transform).p.z = (float)(int)((ulong)uVar8 >> 0x20);
        (this->transform).l.vy.y = (float)(int)uVar6;
        (this->transform).l.vy.z = (float)(int)((ulong)uVar6 >> 0x20);
        (this->transform).l.vz.x = (float)(int)uVar7;
        (this->transform).l.vz.y = (float)(int)((ulong)uVar7 >> 0x20);
        (this->transform).l.vx.x = (float)(int)uVar4;
        (this->transform).l.vx.y = (float)(int)((ulong)uVar4 >> 0x20);
        *(undefined8 *)&(this->transform).l.vx.z = uVar5;
        binary->currentEntityOffset = binary->currentEntityOffset + 0x30;
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Disk::readFrom(BinaryReader &binary) 
  {
    Shape::readFrom(binary);
    binary.read(radius);
    binary.read(height);
    binary.read(transform);
  }